

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcMfs.c
# Opt level: O1

Sfm_Ntk_t * Abc_NtkExtractMfs(Abc_Ntk_t *pNtk,int nFirstFixed)

{
  int iVar1;
  long *plVar2;
  Vec_Ptr_t *vNodes;
  Vec_Wec_t *vFanins;
  Vec_Int_t *pVVar3;
  Vec_Str_t *pVVar4;
  char *__s;
  Vec_Wrd_t *vTruths;
  word *pwVar5;
  Vec_Wrd_t *vTruths2;
  word *__s_00;
  word wVar6;
  ulong uVar7;
  Vec_Ptr_t *pVVar8;
  int *piVar9;
  Sfm_Ntk_t *pSVar10;
  int iVar11;
  ulong uVar12;
  int iVar13;
  long lVar14;
  word (*TruthStore_00) [1024];
  uint nPis;
  uint uVar15;
  size_t __n;
  long lVar16;
  int nTotal;
  Vec_Int_t *pVStack_220d0;
  Vec_Str_t *pVStack_220c8;
  ulong uStack_220c0;
  word *pTruths [16];
  word pCube [1024];
  word TruthStore [16] [1024];
  
  TruthStore_00 = TruthStore;
  memset(TruthStore_00,0,0x20000);
  pTruths[0xe] = (word *)0x0;
  pTruths[0xf] = (word *)0x0;
  pTruths[0xc] = (word *)0x0;
  pTruths[0xd] = (word *)0x0;
  pTruths[10] = (word *)0x0;
  pTruths[0xb] = (word *)0x0;
  pTruths[8] = (word *)0x0;
  pTruths[9] = (word *)0x0;
  pTruths[6] = (word *)0x0;
  pTruths[7] = (word *)0x0;
  pTruths[4] = (word *)0x0;
  pTruths[5] = (word *)0x0;
  pTruths[2] = (word *)0x0;
  pTruths[3] = (word *)0x0;
  pTruths[0] = (word *)0x0;
  pTruths[1] = (word *)0x0;
  memset(pCube,0,0x2000);
  nTotal = 0;
  uStack_220c0 = (ulong)(uint)nFirstFixed;
  if (nFirstFixed == 0) {
    vNodes = Abc_NtkAssignIDs(pNtk);
  }
  else {
    vNodes = Abc_NtkAssignIDs2(pNtk);
  }
  __n = (long)pNtk->vCos->nSize + (long)vNodes->nSize + (long)pNtk->vCis->nSize;
  vFanins = (Vec_Wec_t *)malloc(0x10);
  iVar13 = (int)__n;
  iVar11 = 8;
  if (6 < iVar13 - 1U) {
    iVar11 = iVar13;
  }
  vFanins->nSize = 0;
  vFanins->nCap = iVar11;
  if (iVar11 == 0) {
    pVVar3 = (Vec_Int_t *)0x0;
  }
  else {
    pVVar3 = (Vec_Int_t *)calloc((long)iVar11,0x10);
  }
  vFanins->pArray = pVVar3;
  vFanins->nSize = iVar13;
  pVVar4 = (Vec_Str_t *)malloc(0x10);
  iVar11 = 0x10;
  if (0xe < iVar13 - 1U) {
    iVar11 = iVar13;
  }
  pVVar4->nSize = 0;
  pVVar4->nCap = iVar11;
  if (iVar11 == 0) {
    __s = (char *)0x0;
  }
  else {
    __s = (char *)malloc((long)iVar11);
  }
  pVVar4->pArray = __s;
  pVVar4->nSize = iVar13;
  memset(__s,0,__n);
  vTruths = (Vec_Wrd_t *)malloc(0x10);
  vTruths->nSize = 0;
  vTruths->nCap = iVar11;
  if (iVar11 == 0) {
    pwVar5 = (word *)0x0;
  }
  else {
    pwVar5 = (word *)malloc((long)iVar11 << 3);
  }
  vTruths->pArray = pwVar5;
  vTruths->nSize = iVar13;
  __s_00 = (word *)0x0;
  memset(pwVar5,0,__n * 8);
  pVStack_220d0 = Abc_NtkAssignStarts(pNtk,vNodes,&nTotal);
  iVar13 = nTotal;
  lVar16 = (long)nTotal;
  vTruths2 = (Vec_Wrd_t *)malloc(0x10);
  iVar11 = 0x10;
  if (0xe < iVar13 - 1U) {
    iVar11 = iVar13;
  }
  vTruths2->nSize = 0;
  vTruths2->nCap = iVar11;
  if (iVar11 != 0) {
    __s_00 = (word *)malloc((long)iVar11 << 3);
  }
  vTruths2->pArray = __s_00;
  vTruths2->nSize = iVar13;
  lVar14 = 0;
  pVStack_220c8 = pVVar4;
  memset(__s_00,0,lVar16 << 3);
  Abc_NtkFillTruthStore(TruthStore_00);
  do {
    pTruths[lVar14] = *TruthStore_00;
    lVar14 = lVar14 + 1;
    TruthStore_00 = TruthStore_00 + 1;
  } while (lVar14 != 0x10);
  if (0 < vNodes->nSize) {
    lVar16 = 0;
    do {
      plVar2 = (long *)vNodes->pArray[lVar16];
      iVar13 = *(int *)((long)plVar2 + 0x1c);
      if (iVar13 < 7) {
        wVar6 = Abc_SopToTruth((char *)plVar2[7],iVar13);
        iVar13 = (int)plVar2[8];
        if (((long)iVar13 < 0) || (vTruths->nSize <= iVar13)) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecWrd.h"
                        ,0x1cf,"void Vec_WrdWriteEntry(Vec_Wrd_t *, int, word)");
        }
        vTruths->pArray[iVar13] = wVar6;
        if (wVar6 - 1 < 0xfffffffffffffffe) {
LAB_002dd82c:
          lVar14 = (long)(int)plVar2[8];
          if ((lVar14 < 0) || (vFanins->nSize <= (int)plVar2[8])) goto LAB_002dda59;
          pVVar3 = vFanins->pArray + lVar14;
          iVar13 = *(int *)((long)plVar2 + 0x1c);
          if (vFanins->pArray[lVar14].nCap < iVar13) {
            if (pVVar3->pArray == (int *)0x0) {
              piVar9 = (int *)malloc((long)iVar13 << 2);
            }
            else {
              piVar9 = (int *)realloc(pVVar3->pArray,(long)iVar13 << 2);
            }
            pVVar3->pArray = piVar9;
            if (piVar9 == (int *)0x0) goto LAB_002ddaf4;
            pVVar3->nCap = iVar13;
          }
          if (0 < *(int *)((long)plVar2 + 0x1c)) {
            lVar14 = 0;
            do {
              Vec_IntPush(pVVar3,*(int *)(*(long *)(*(long *)(*(long *)(*plVar2 + 0x20) + 8) +
                                                   (long)*(int *)(plVar2[4] + lVar14 * 4) * 8) +
                                         0x40));
              lVar14 = lVar14 + 1;
            } while (lVar14 < *(int *)((long)plVar2 + 0x1c));
          }
        }
      }
      else {
        iVar11 = iVar13 + -6;
        uVar15 = 1 << ((byte)iVar11 & 0x1f);
        iVar1 = (int)plVar2[8];
        if (((long)iVar1 < 0) || (pVStack_220d0->nSize <= iVar1)) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                        ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        iVar1 = pVStack_220d0->pArray[iVar1];
        if (((long)iVar1 < 0) || (vTruths2->nSize <= iVar1)) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecWrd.h"
                        ,0x1be,"word *Vec_WrdEntryP(Vec_Wrd_t *, int)");
        }
        pwVar5 = vTruths2->pArray + iVar1;
        Abc_SopToTruthBig((char *)plVar2[7],iVar13,pTruths,pCube,pwVar5);
        uVar7 = 0;
        if (iVar11 != 0x1f) {
          uVar7 = 1;
          if (1 < (int)uVar15) {
            uVar7 = (ulong)uVar15;
          }
          uVar12 = 0;
          do {
            if (pwVar5[uVar12] != 0) {
              uVar7 = uVar12 & 0xffffffff;
              break;
            }
            uVar12 = uVar12 + 1;
          } while (uVar7 != uVar12);
        }
        if ((uint)uVar7 != uVar15) {
          uVar7 = 0;
          if (iVar11 != 0x1f) {
            uVar7 = 1;
            if (1 < (int)uVar15) {
              uVar7 = (ulong)uVar15;
            }
            uVar12 = 0;
            do {
              if (pwVar5[uVar12] != 0xffffffffffffffff) {
                uVar7 = uVar12 & 0xffffffff;
                break;
              }
              uVar12 = uVar12 + 1;
            } while (uVar7 != uVar12);
          }
          if ((uint)uVar7 != uVar15) goto LAB_002dd82c;
        }
      }
      lVar16 = lVar16 + 1;
    } while (lVar16 < vNodes->nSize);
  }
  pVVar8 = pNtk->vCos;
  if (0 < pVVar8->nSize) {
    lVar16 = 0;
    do {
      plVar2 = (long *)pVVar8->pArray[lVar16];
      lVar14 = (long)(int)plVar2[8];
      if ((lVar14 < 0) || (vFanins->nSize <= (int)plVar2[8])) {
LAB_002dda59:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecWec.h"
                      ,0x9c,"Vec_Int_t *Vec_WecEntry(Vec_Wec_t *, int)");
      }
      pVVar3 = vFanins->pArray + lVar14;
      iVar13 = *(int *)((long)plVar2 + 0x1c);
      if (vFanins->pArray[lVar14].nCap < iVar13) {
        if (pVVar3->pArray == (int *)0x0) {
          piVar9 = (int *)malloc((long)iVar13 << 2);
        }
        else {
          piVar9 = (int *)realloc(pVVar3->pArray,(long)iVar13 << 2);
        }
        pVVar3->pArray = piVar9;
        if (piVar9 == (int *)0x0) {
LAB_002ddaf4:
          __assert_fail("p->pArray",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                        ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
        }
        pVVar3->nCap = iVar13;
      }
      if (0 < *(int *)((long)plVar2 + 0x1c)) {
        lVar14 = 0;
        do {
          Vec_IntPush(pVVar3,*(int *)(*(long *)(*(long *)(*(long *)(*plVar2 + 0x20) + 8) +
                                               (long)*(int *)(plVar2[4] + lVar14 * 4) * 8) + 0x40));
          lVar14 = lVar14 + 1;
        } while (lVar14 < *(int *)((long)plVar2 + 0x1c));
      }
      lVar16 = lVar16 + 1;
      pVVar8 = pNtk->vCos;
    } while (lVar16 < pVVar8->nSize);
  }
  pVVar4 = pVStack_220c8;
  if (vNodes->pArray != (void **)0x0) {
    free(vNodes->pArray);
    vNodes->pArray = (void **)0x0;
  }
  uVar7 = uStack_220c0;
  if (vNodes != (Vec_Ptr_t *)0x0) {
    free(vNodes);
  }
  uVar15 = pNtk->vCis->nSize;
  uVar12 = (ulong)uVar15;
  iVar13 = (int)uVar7;
  nPis = uVar15;
  if (0 < iVar13) {
    do {
      if (((int)uVar15 < 0) || (pVVar4->nSize <= (int)uVar12)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecStr.h"
                      ,0x186,"void Vec_StrWriteEntry(Vec_Str_t *, int, char)");
      }
      pVVar4->pArray[uVar12] = '\x01';
      uVar12 = uVar12 + 1;
      nPis = pNtk->vCis->nSize;
    } while ((int)uVar12 < (int)(nPis + iVar13));
  }
  if ((-1 < iVar13) && (iVar13 < pNtk->nObjCounts[7])) {
    pSVar10 = Sfm_NtkConstruct(vFanins,nPis,pNtk->vCos->nSize,pVVar4,(Vec_Str_t *)0x0,vTruths,
                               pVStack_220d0,vTruths2);
    return pSVar10;
  }
  __assert_fail("nFirstFixed >= 0 && nFirstFixed < Abc_NtkNodeNum(pNtk)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcMfs.c"
                ,0xd2,"Sfm_Ntk_t *Abc_NtkExtractMfs(Abc_Ntk_t *, int)");
}

Assistant:

Sfm_Ntk_t * Abc_NtkExtractMfs( Abc_Ntk_t * pNtk, int nFirstFixed )
{
    word TruthStore[16][1<<10] = {{0}}, * pTruths[16] = {NULL}, pCube[1<<10] = {0};
    Vec_Ptr_t * vNodes;
    Vec_Wec_t * vFanins;
    Vec_Str_t * vFixed;
    Vec_Wrd_t * vTruths;
    Vec_Int_t * vArray;
    Vec_Int_t * vStarts;
    Vec_Wrd_t * vTruths2;
    Abc_Obj_t * pObj, * pFanin;
    int i, k, nObjs, nTotal = 0;
    vNodes  = nFirstFixed ? Abc_NtkAssignIDs2(pNtk) : Abc_NtkAssignIDs(pNtk);
    nObjs   = Abc_NtkCiNum(pNtk) + Vec_PtrSize(vNodes) + Abc_NtkCoNum(pNtk);
    vFanins = Vec_WecStart( nObjs );
    vFixed  = Vec_StrStart( nObjs );
    vTruths = Vec_WrdStart( nObjs );
    vStarts = Abc_NtkAssignStarts( pNtk, vNodes, &nTotal );
    vTruths2= Vec_WrdStart( nTotal );
    Abc_NtkFillTruthStore( TruthStore );
    for ( i = 0; i < 16; i++ )
        pTruths[i] = TruthStore[i];
    Vec_PtrForEachEntry( Abc_Obj_t *, vNodes, pObj, i )
    {
        if ( Abc_ObjFaninNum(pObj) <= 6 )
        {
            word uTruth = Abc_SopToTruth((char *)pObj->pData, Abc_ObjFaninNum(pObj));
            Vec_WrdWriteEntry( vTruths, pObj->iTemp, uTruth );
            if ( uTruth == 0 || ~uTruth == 0 )
                continue;
        }
        else
        {
            int nWords  = Abc_Truth6WordNum( Abc_ObjFaninNum(pObj) );
            int Offset  = Vec_IntEntry( vStarts, pObj->iTemp );
            word * pRes = Vec_WrdEntryP( vTruths2, Offset );
            Abc_SopToTruthBig( (char *)pObj->pData, Abc_ObjFaninNum(pObj), pTruths, pCube, pRes );
            // check const0
            for ( k = 0; k < nWords; k++ )
                if ( pRes[k] )
                    break;
            if ( k == nWords )
                continue;
            // check const1
            for ( k = 0; k < nWords; k++ )
                if ( ~pRes[k] )
                    break;
            if ( k == nWords )
                continue;
        }
        vArray = Vec_WecEntry( vFanins, pObj->iTemp );
        Vec_IntGrow( vArray, Abc_ObjFaninNum(pObj) );
        Abc_ObjForEachFanin( pObj, pFanin, k )
            Vec_IntPush( vArray, pFanin->iTemp );
        //Vec_IntPrint( vArray );
    }
    Abc_NtkForEachCo( pNtk, pObj, i )
    {
        vArray = Vec_WecEntry( vFanins, pObj->iTemp );
        Vec_IntGrow( vArray, Abc_ObjFaninNum(pObj) );
        Abc_ObjForEachFanin( pObj, pFanin, k )
            Vec_IntPush( vArray, pFanin->iTemp );
    }
    Vec_PtrFree( vNodes );
    for ( i = Abc_NtkCiNum(pNtk); i < Abc_NtkCiNum(pNtk) + nFirstFixed; i++ )
        Vec_StrWriteEntry( vFixed, i, (char)1 );
    // update fixed
    assert( nFirstFixed >= 0 && nFirstFixed < Abc_NtkNodeNum(pNtk) );
//    for ( i = Abc_NtkCiNum(pNtk); i + Abc_NtkCoNum(pNtk) < Abc_NtkObjNum(pNtk); i++ )
//        if ( rand() % 10 == 0 )
//            Vec_StrWriteEntry( vFixed, i, (char)1 );
    return Sfm_NtkConstruct( vFanins, Abc_NtkCiNum(pNtk), Abc_NtkCoNum(pNtk), vFixed, NULL, vTruths, vStarts, vTruths2 );
}